

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdash_reporter_tests.c
# Opt level: O3

int mocked_printer(FILE *stream,char *format,...)

{
  char in_AL;
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  char *in_R8;
  char *in_R9;
  char *in_XMM0_Qa;
  char *in_XMM1_Qa;
  char *in_XMM2_Qa;
  _IO_marker *in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  __off64_t in_XMM6_Qa;
  _IO_wide_data *in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_d8;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_78;
  char *local_68;
  _IO_marker *local_58;
  undefined8 local_48;
  undefined8 local_38;
  __off64_t local_28;
  _IO_wide_data *local_18;
  
  local_d8.reg_save_area = &stack0xffffffffffffff48;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.overflow_arg_area = &ap[0].overflow_arg_area;
  local_d8.gp_offset = 0x10;
  local_d8.fp_offset = 0x30;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  iVar1 = mocked_vprinter((FILE *)local_d8.reg_save_area,format,&local_d8);
  return iVar1;
}

Assistant:

static int mocked_printer(FILE *stream, const char *format, ...) {
    int result = 0;

    va_list ap;
    va_start(ap, format);
    result = mocked_vprinter(stream, format, ap);
    va_end(ap);

    return result;
}